

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osstzprs.c
# Opt level: O1

char * parse_offset(int *secs,char *p,size_t *len)

{
  ulong uVar1;
  ushort **ppuVar2;
  int iVar3;
  int ss;
  int mm;
  int hh;
  int local_34;
  int local_30;
  int local_2c;
  
  local_2c = 0;
  local_30 = 0;
  local_34 = 0;
  uVar1 = *len;
  iVar3 = 1;
  if (uVar1 < 2) goto LAB_00122afb;
  if (*p == '+') {
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) == 0) goto LAB_00122ac3;
    iVar3 = 1;
  }
  else {
LAB_00122ac3:
    if ((uVar1 < 2) || (*p != '-')) goto LAB_00122afb;
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) == 0) goto LAB_00122afb;
    iVar3 = -1;
  }
  p = p + 1;
  *len = uVar1 - 1;
LAB_00122afb:
  if (*len != 0) {
    ppuVar2 = __ctype_b_loc();
    if ((*(byte *)((long)*ppuVar2 + (long)*p * 2 + 1) & 8) != 0) {
      p = parse_digits(&local_2c,p,len);
      if ((((2 < *len) && (*p == ':')) &&
          ((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) != 0)) &&
         ((*(byte *)((long)*ppuVar2 + (long)p[2] * 2 + 1) & 8) != 0)) {
        *len = *len - 1;
        p = parse_digits(&local_30,p + 1,len);
        if (((2 < *len) && (*p == ':')) &&
           (((*(byte *)((long)*ppuVar2 + (long)p[1] * 2 + 1) & 8) != 0 &&
            ((*(byte *)((long)*ppuVar2 + (long)p[2] * 2 + 1) & 8) != 0)))) {
          *len = *len - 1;
          p = parse_digits(&local_34,p + 1,len);
        }
      }
      *secs = (local_30 * 0x3c + local_2c * 0xe10 + local_34) * iVar3;
    }
  }
  return p;
}

Assistant:

static const char *parse_offset(int *secs, const char *p, size_t *len)
{
    int sign = 1, hh = 0, mm = 0, ss = 0;
    
    /* check for a sign (which must be followed by a digit) */
    if (*len >= 2 && *p == '+' && isdigit(p[1]))
        ++p, --*len;
    else if (*len >= 2 && *p == '-' && isdigit(p[1]))
        sign = -1, ++p, --*len;

    /* if we don't have a digit, it's not a number */
    if (*len == 0 || !isdigit(*p))
        return p;

    /* parse the hours */
    p = parse_digits(&hh, p, len);

    /* check for minutes */
    if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
    {
        /* parse the minutes */
        ++p, --*len;
        p = parse_digits(&mm, p, len);

        /* check for seconds */
        if (*len >= 3 && *p == ':' && isdigit(p[1]) && isdigit(p[2]))
        {
            ++p, --*len;
            p = parse_digits(&ss, p, len);
        }
    }

    /* compute the full time in seconds, and apply the sign */
    *secs = sign*(hh*60*60 + mm*60 + ss);

    /* return the updated pointer */
    return p;
}